

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.c
# Opt level: O0

dlep_status dlep_base_proto_print_status(dlep_session *session)

{
  int iVar1;
  char local_138 [8];
  char text [256];
  dlep_status local_2c;
  dlep_session *pdStack_28;
  dlep_status status;
  dlep_session *session_local;
  undefined4 local_18;
  oonf_log_source local_14;
  undefined *local_10;
  
  pdStack_28 = session;
  iVar1 = dlep_reader_status(&local_2c,local_138,0x100,session,(dlep_parser_value *)0x0);
  if (iVar1 == 0) {
    local_14 = pdStack_28->log_source;
    local_10 = &log_global_mask;
    local_18 = 1;
    if (((&log_global_mask)[local_14] & 1) != 0) {
      oonf_log(1,pdStack_28->log_source,"src/generic/dlep/ext_base_proto/proto.c",0x1e8,0,0,
               "Status %d received: %s",local_2c,local_138);
    }
    session_local._4_4_ = local_2c;
  }
  else {
    session_local._4_4_ = DLEP_STATUS_OKAY;
  }
  return session_local._4_4_;
}

Assistant:

enum dlep_status
dlep_base_proto_print_status(struct dlep_session *session)
{
  enum dlep_status status;
  char text[256];

  if (!dlep_reader_status(&status, text, sizeof(text), session, NULL)) {
    OONF_DEBUG(session->log_source, "Status %d received: %s", status, text);

    return status;
  }
  return DLEP_STATUS_OKAY;
}